

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O3

void __thiscall embree::SubdivMesh::initializeHalfEdgeStructures(SubdivMesh *this)

{
  mvector<uint32_t> *pmVar1;
  uint *puVar2;
  MemoryMonitorInterface *pMVar3;
  RawBufferView *pRVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vector_t<unsigned_int,_embree::aligned_monitored_allocator<unsigned_int,_4UL>_> *pvVar33;
  char cVar34;
  bool bVar35;
  uint uVar36;
  int iVar37;
  char *pcVar38;
  uint *puVar39;
  ulong uVar40;
  ostream *poVar41;
  runtime_error *prVar42;
  long lVar43;
  bool *pbVar44;
  unsigned_long uVar45;
  char *pcVar46;
  ulong uVar47;
  size_t sVar48;
  size_t sVar49;
  pointer pvVar50;
  ulong uVar51;
  Topology *t;
  ulong uVar52;
  Topology *this_00;
  long lVar53;
  undefined1 auVar54 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  int iVar77;
  int iVar78;
  undefined1 auVar75 [16];
  int iVar79;
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  int iVar93;
  int iVar97;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  size_t taskCount;
  task_group_context context;
  ParallelPrefixSumState<int> state;
  undefined1 local_336 [2];
  uint local_334;
  vector_t<unsigned_int,_embree::aligned_monitored_allocator<unsigned_int,_4UL>_> *local_330;
  unsigned_long local_328;
  unsigned_long local_320;
  ulong local_318;
  BufferView<unsigned_int> *local_310;
  double local_308;
  anon_class_8_1_898bcfc2_conflict23 local_300;
  anon_class_32_4_2dac733d_conflict local_2f8;
  anon_class_40_5_11684cf9_conflict6 local_2d8;
  task_group_context local_2b0;
  ParallelPrefixSumState<int> local_230;
  
  local_308 = getSeconds();
  sVar49 = (this->faceVertices).super_RawBufferView.num;
  uVar47 = (this->super_Geometry).numTimeSteps * sVar49;
  uVar40 = (this->invalid_face).size_alloced;
  uVar52 = uVar40;
  if ((uVar40 < uVar47) && (uVar52 = uVar47, uVar51 = uVar40, uVar40 != 0)) {
    do {
      uVar52 = uVar51 * 2 + (ulong)(uVar51 * 2 == 0);
      uVar51 = uVar52;
    } while (uVar52 < uVar47);
  }
  if (uVar47 < (this->invalid_face).size_active) {
    (this->invalid_face).size_active = uVar47;
  }
  if (uVar40 == uVar52) {
    (this->invalid_face).size_active = uVar47;
  }
  else {
    pcVar46 = (this->invalid_face).items;
    if ((uVar52 == 0) ||
       (pMVar3 = (this->invalid_face).alloc.device,
       (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,uVar52,0), uVar52 < 0x1c00000)) {
      pcVar38 = (char *)alignedMalloc(uVar52,1);
    }
    else {
      pcVar38 = (char *)os_malloc(uVar52,&(this->invalid_face).alloc.hugepages);
    }
    (this->invalid_face).items = pcVar38;
    if ((this->invalid_face).size_active == 0) {
      sVar49 = (this->invalid_face).size_alloced;
      if (pcVar46 != (char *)0x0) goto LAB_00d2ffc5;
LAB_00d2ffea:
      if (sVar49 != 0) goto LAB_00d2ffef;
    }
    else {
      uVar40 = 0;
      do {
        (this->invalid_face).items[uVar40] = pcVar46[uVar40];
        uVar40 = uVar40 + 1;
      } while (uVar40 < (this->invalid_face).size_active);
      sVar49 = (this->invalid_face).size_alloced;
LAB_00d2ffc5:
      if (sVar49 < 0x1c00000) {
        alignedFree(pcVar46);
        goto LAB_00d2ffea;
      }
      os_free(pcVar46,sVar49,(this->invalid_face).alloc.hugepages);
LAB_00d2ffef:
      pMVar3 = (this->invalid_face).alloc.device;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,-sVar49,1);
    }
    (this->invalid_face).size_active = uVar47;
    (this->invalid_face).size_alloced = uVar52;
    sVar49 = (this->faceVertices).super_RawBufferView.num;
  }
  uVar40 = (this->faceStartEdge).size_alloced;
  uVar52 = uVar40;
  if ((uVar40 < sVar49) && (uVar52 = sVar49, uVar47 = uVar40, uVar40 != 0)) {
    do {
      uVar52 = uVar47 * 2 + (ulong)(uVar47 * 2 == 0);
      uVar47 = uVar52;
    } while (uVar52 < sVar49);
  }
  if (sVar49 < (this->faceStartEdge).size_active) {
    (this->faceStartEdge).size_active = sVar49;
  }
  pmVar1 = &this->faceStartEdge;
  if (uVar40 == uVar52) {
    (this->faceStartEdge).size_active = sVar49;
  }
  else {
    puVar2 = (this->faceStartEdge).items;
    if (uVar52 == 0) {
      uVar40 = 0;
LAB_00d300a9:
      puVar39 = (uint *)alignedMalloc(uVar40,4);
    }
    else {
      pMVar3 = (pmVar1->alloc).device;
      uVar40 = uVar52 * 4;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,uVar40,0);
      if (uVar40 < 0x1c00000) goto LAB_00d300a9;
      puVar39 = (uint *)os_malloc(uVar40,&(this->faceStartEdge).alloc.hugepages);
    }
    (this->faceStartEdge).items = puVar39;
    if ((this->faceStartEdge).size_active == 0) {
      sVar48 = (this->faceStartEdge).size_alloced;
      if (puVar2 != (uint *)0x0) goto LAB_00d300f8;
    }
    else {
      uVar40 = 0;
      do {
        (this->faceStartEdge).items[uVar40] = puVar2[uVar40];
        uVar40 = uVar40 + 1;
      } while (uVar40 < (this->faceStartEdge).size_active);
      sVar48 = (this->faceStartEdge).size_alloced;
LAB_00d300f8:
      if (sVar48 * 4 < 0x1c00000) {
        alignedFree(puVar2);
      }
      else {
        os_free(puVar2,sVar48 * 4,(this->faceStartEdge).alloc.hugepages);
      }
    }
    if (sVar48 != 0) {
      pMVar3 = (pmVar1->alloc).device;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,sVar48 * -4,1);
    }
    (this->faceStartEdge).size_active = sVar49;
    (this->faceStartEdge).size_alloced = uVar52;
  }
  if ((this->faceVertices).super_RawBufferView.modified != true) goto LAB_00d3059c;
  uVar40 = (this->faceVertices).super_RawBufferView.num;
  local_334 = 0;
  if (uVar40 < 0x1000) {
    if (uVar40 == 0) {
      uVar36 = 0;
    }
    else {
      uVar36 = 0;
      uVar52 = 0;
      do {
        (this->faceStartEdge).items[uVar52] = uVar36;
        uVar47 = uVar52 + 1;
        uVar36 = uVar36 + *(int *)((this->faceVertices).super_RawBufferView.ptr_ofs +
                                  uVar52 * (this->faceVertices).super_RawBufferView.stride);
        uVar52 = uVar47;
      } while (uVar40 != uVar47);
    }
  }
  else {
    local_310 = &this->faceVertices;
    local_2f8.identity = (int *)&local_334;
    local_2f8.dst =
         (vector_t<unsigned_int,_embree::aligned_monitored_allocator<unsigned_int,_4UL>_> *)
         local_336;
    local_320 = 0;
    local_330 = pmVar1;
    local_318 = uVar40;
    local_2f8.add = (plus<unsigned_int> *)local_310;
    iVar37 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    uVar52 = (local_318 - local_320) + 0x3ff >> 10;
    if ((ulong)(long)iVar37 < uVar52) {
      uVar52 = (long)iVar37;
    }
    uVar45 = 0x40;
    if (uVar52 < 0x40) {
      uVar45 = uVar52;
    }
    local_2d8.taskCount = &local_328;
    local_2d8.state = &local_230;
    local_2b0.my_version = proxy_support;
    local_2b0.my_traits = (context_traits)0x4;
    local_2b0.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_2b0.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_2b0.my_name = CUSTOM_CTX;
    local_328 = uVar45;
    local_2d8.first = &local_320;
    local_2d8.last = &local_318;
    local_2d8.func = &local_2f8;
    tbb::detail::r1::initialize(&local_2b0);
    local_300.func = &local_2d8;
    tbb::detail::d1::
    parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
              (0,uVar45,1,(anon_class_8_1_898bcfc2_conflict22 *)&local_300,
               (auto_partitioner *)(local_336 + 1),&local_2b0);
    cVar34 = tbb::detail::r1::is_group_execution_cancelled(&local_2b0);
    pvVar33 = local_330;
    if (cVar34 != '\0') {
      prVar42 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar42,"task cancelled");
      __cxa_throw(prVar42,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_2b0);
    if (local_328 != 0) {
      uVar45 = 0;
      uVar36 = local_334;
      do {
        local_230.sums[uVar45] = uVar36;
        uVar36 = uVar36 + local_230.counts[uVar45];
        uVar45 = uVar45 + 1;
      } while (local_328 != uVar45);
    }
    local_2f8.identity = (int *)&local_334;
    local_2f8.dst = pvVar33;
    local_2f8.add = (plus<unsigned_int> *)local_336;
    local_2f8.src = local_310;
    local_320 = 0;
    local_318 = uVar40;
    iVar37 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    uVar40 = (local_318 - local_320) + 0x3ff >> 10;
    if ((ulong)(long)iVar37 < uVar40) {
      uVar40 = (long)iVar37;
    }
    uVar45 = 0x40;
    if (uVar40 < 0x40) {
      uVar45 = uVar40;
    }
    local_2d8.first = &local_320;
    local_2d8.taskCount = &local_328;
    local_2d8.state = &local_230;
    local_2d8.func = &local_2f8;
    local_2b0.my_version = proxy_support;
    local_2b0.my_traits = (context_traits)0x4;
    local_2b0.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_2b0.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_2b0.my_name = CUSTOM_CTX;
    local_328 = uVar45;
    local_2d8.last = &local_318;
    tbb::detail::r1::initialize(&local_2b0);
    local_300.func = &local_2d8;
    tbb::detail::d1::
    parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
              (0,uVar45,1,&local_300,(auto_partitioner *)(local_336 + 1),&local_2b0);
    cVar34 = tbb::detail::r1::is_group_execution_cancelled(&local_2b0);
    if (cVar34 != '\0') {
      prVar42 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar42,"task cancelled");
      __cxa_throw(prVar42,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_2b0);
    in_XMM1._8_8_ = extraout_XMM1_Qb;
    in_XMM1._0_8_ = extraout_XMM1_Qa;
    uVar36 = local_334;
    if (local_328 != 0) {
      uVar45 = 0;
      do {
        local_230.sums[uVar45] = uVar36;
        uVar36 = uVar36 + local_230.counts[uVar45];
        uVar45 = uVar45 + 1;
      } while (local_328 != uVar45);
    }
  }
  uVar47 = (ulong)(int)uVar36;
  this->numHalfEdges = uVar47;
  uVar40 = (this->halfEdgeFace).size_alloced;
  uVar52 = uVar40;
  if ((uVar40 < uVar47) && (uVar52 = uVar47, uVar51 = uVar40, uVar40 != 0)) {
    do {
      uVar52 = uVar51 * 2 + (ulong)(uVar51 * 2 == 0);
      uVar51 = uVar52;
    } while (uVar52 < uVar47);
  }
  if (uVar47 < (this->halfEdgeFace).size_active) {
    (this->halfEdgeFace).size_active = uVar47;
  }
  if (uVar40 == uVar52) {
    (this->halfEdgeFace).size_active = uVar47;
  }
  else {
    puVar2 = (this->halfEdgeFace).items;
    if (uVar52 == 0) {
      uVar40 = 0;
LAB_00d3049c:
      puVar39 = (uint *)alignedMalloc(uVar40,4);
    }
    else {
      pMVar3 = (this->halfEdgeFace).alloc.device;
      uVar40 = uVar52 * 4;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,uVar40,0);
      if (uVar40 < 0x1c00000) goto LAB_00d3049c;
      puVar39 = (uint *)os_malloc(uVar40,&(this->halfEdgeFace).alloc.hugepages);
    }
    (this->halfEdgeFace).items = puVar39;
    if ((this->halfEdgeFace).size_active == 0) {
      sVar49 = (this->halfEdgeFace).size_alloced;
      if (puVar2 != (uint *)0x0) goto LAB_00d304eb;
    }
    else {
      uVar40 = 0;
      do {
        (this->halfEdgeFace).items[uVar40] = puVar2[uVar40];
        uVar40 = uVar40 + 1;
      } while (uVar40 < (this->halfEdgeFace).size_active);
      sVar49 = (this->halfEdgeFace).size_alloced;
LAB_00d304eb:
      if (sVar49 * 4 < 0x1c00000) {
        alignedFree(puVar2);
      }
      else {
        os_free(puVar2,sVar49 * 4,(this->halfEdgeFace).alloc.hugepages);
      }
    }
    if (sVar49 != 0) {
      pMVar3 = (this->halfEdgeFace).alloc.device;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,sVar49 * -4,1);
    }
    (this->halfEdgeFace).size_active = uVar47;
    (this->halfEdgeFace).size_alloced = uVar52;
  }
  sVar49 = (this->faceVertices).super_RawBufferView.num;
  if (sVar49 != 0) {
    pcVar46 = (this->faceVertices).super_RawBufferView.ptr_ofs;
    sVar48 = (this->faceVertices).super_RawBufferView.stride;
    uVar40 = 0;
    lVar43 = 0;
    do {
      if (*(int *)(pcVar46 + sVar48 * uVar40) != 0) {
        uVar52 = 0;
        do {
          (this->halfEdgeFace).items[lVar43] = (uint)uVar40;
          lVar43 = lVar43 + 1;
          uVar52 = uVar52 + 1;
          pcVar46 = (this->faceVertices).super_RawBufferView.ptr_ofs;
          sVar48 = (this->faceVertices).super_RawBufferView.stride;
        } while (uVar52 < *(uint *)(pcVar46 + sVar48 * uVar40));
        sVar49 = (this->faceVertices).super_RawBufferView.num;
      }
      uVar40 = uVar40 + 1;
    } while (uVar40 < sVar49);
  }
LAB_00d3059c:
  if (((this->vertex_creases).super_RawBufferView.modified != false) ||
     ((this->vertex_crease_weights).super_RawBufferView.modified == true)) {
    parallel_map<unsigned_int,float>::
    init<embree::BufferView<unsigned_int>,embree::BufferView<float>>
              ((parallel_map<unsigned_int,float> *)
               (this->vertexCreaseMap)._M_t.
               super___uniq_ptr_impl<embree::VertexCreaseMap,_std::default_delete<embree::VertexCreaseMap>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::VertexCreaseMap_*,_std::default_delete<embree::VertexCreaseMap>_>
               .super__Head_base<0UL,_embree::VertexCreaseMap_*,_false>._M_head_impl,
               &this->vertex_creases,&this->vertex_crease_weights);
  }
  if (((this->edge_creases).super_RawBufferView.modified != false) ||
     ((this->edge_crease_weights).super_RawBufferView.modified == true)) {
    parallel_map<unsigned_long,float>::
    init<embree::BufferView<embree::HalfEdge::Edge>,embree::BufferView<float>>
              ((parallel_map<unsigned_long,float> *)
               (this->edgeCreaseMap)._M_t.
               super___uniq_ptr_impl<embree::EdgeCreaseMap,_std::default_delete<embree::EdgeCreaseMap>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::EdgeCreaseMap_*,_std::default_delete<embree::EdgeCreaseMap>_>
               .super__Head_base<0UL,_embree::EdgeCreaseMap_*,_false>._M_head_impl,
               &this->edge_creases,&this->edge_crease_weights);
  }
  if ((this->holes).super_RawBufferView.modified == true) {
    parallel_set<unsigned_int>::init<embree::BufferView<unsigned_int>>
              (&((this->holeSet)._M_t.
                 super___uniq_ptr_impl<embree::HoleSet,_std::default_delete<embree::HoleSet>_>._M_t.
                 super__Tuple_impl<0UL,_embree::HoleSet_*,_std::default_delete<embree::HoleSet>_>.
                 super__Head_base<0UL,_embree::HoleSet_*,_false>._M_head_impl)->holeSet,&this->holes
              );
  }
  sVar49 = (this->topology).size_active;
  if (sVar49 != 0) {
    this_00 = (this->topology).items;
    lVar43 = sVar49 * 0xa0;
    do {
      Topology::initializeHalfEdgeStructures(this_00);
      this_00 = this_00 + 1;
      lVar43 = lVar43 + -0xa0;
    } while (lVar43 != 0);
  }
  pvVar50 = (this->vertex_buffer_tags).
            super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->vertex_buffer_tags).
      super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar50) {
    lVar43 = 0x10;
    lVar53 = 0;
    uVar40 = 0;
    do {
      std::
      vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
      ::resize((vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
                *)((long)&(pvVar50->
                          super__Vector_base<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar53),
               ((ulong)*(uint *)((long)&(((this->vertices).items)->super_RawBufferView).ptr_ofs +
                                lVar43) + 0xf >> 4) * (this->faceVertices).super_RawBufferView.num);
      uVar40 = uVar40 + 1;
      pvVar50 = (this->vertex_buffer_tags).
                super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar53 = lVar53 + 0x18;
      lVar43 = lVar43 + 0x38;
    } while (uVar40 < (ulong)(((long)(this->vertex_buffer_tags).
                                     super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar50 >> 3
                              ) * -0x5555555555555555));
  }
  uVar40 = (this->vertexAttribs).size_active;
  if (uVar40 != 0) {
    lVar43 = 0x10;
    lVar53 = 0;
    uVar52 = 0;
    do {
      pRVar4 = (this->vertexAttribs).items;
      if (*(long *)((long)pRVar4 + lVar43 + -0x10) != 0) {
        std::
        vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
        ::resize((vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
                  *)((long)&(((this->vertex_attrib_buffer_tags).
                              super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar53),
                 ((ulong)*(uint *)((long)&pRVar4->ptr_ofs + lVar43) + 0xf >> 4) *
                 (this->faceVertices).super_RawBufferView.num);
        uVar40 = (this->vertexAttribs).size_active;
      }
      uVar52 = uVar52 + 1;
      lVar43 = lVar43 + 0x38;
      lVar53 = lVar53 + 0x18;
    } while (uVar52 < uVar40);
  }
  (this->faceVertices).super_RawBufferView.modified = false;
  (this->holes).super_RawBufferView.modified = false;
  auVar32 = _DAT_01fabed0;
  auVar31 = _DAT_01fabec0;
  auVar30 = _DAT_01fabeb0;
  auVar29 = _DAT_01fabea0;
  auVar28 = _DAT_01fabe90;
  auVar27 = _DAT_01f7baf0;
  auVar64 = _DAT_01f7b6d0;
  sVar49 = (this->vertices).size_active;
  if (sVar49 != 0) {
    uVar40 = sVar49 * 0x38 - 0x38 >> 3;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar40;
    auVar54._8_4_ = SUB164(auVar75 * ZEXT816(0x2492492492492493),8);
    auVar54._0_8_ = uVar40 / 7;
    auVar54._12_4_ = (int)(uVar40 / 0x700000000);
    pbVar44 = &(this->vertices).items[0xf].super_RawBufferView.modified;
    uVar52 = 0;
    do {
      auVar73._8_4_ = (int)uVar52;
      auVar73._0_8_ = uVar52;
      auVar73._12_4_ = (int)(uVar52 >> 0x20);
      auVar75 = auVar54 ^ auVar64;
      auVar80 = (auVar73 | auVar27) ^ auVar64;
      iVar37 = auVar75._0_4_;
      iVar93 = -(uint)(iVar37 < auVar80._0_4_);
      iVar77 = auVar75._4_4_;
      auVar82._4_4_ = -(uint)(iVar77 < auVar80._4_4_);
      iVar78 = auVar75._8_4_;
      iVar97 = -(uint)(iVar78 < auVar80._8_4_);
      iVar79 = auVar75._12_4_;
      auVar82._12_4_ = -(uint)(iVar79 < auVar80._12_4_);
      auVar55._4_4_ = iVar93;
      auVar55._0_4_ = iVar93;
      auVar55._8_4_ = iVar97;
      auVar55._12_4_ = iVar97;
      auVar75 = pshuflw(in_XMM1,auVar55,0xe8);
      auVar81._4_4_ = -(uint)(auVar80._4_4_ == iVar77);
      auVar81._12_4_ = -(uint)(auVar80._12_4_ == iVar79);
      auVar81._0_4_ = auVar81._4_4_;
      auVar81._8_4_ = auVar81._12_4_;
      auVar65 = pshuflw(in_XMM2,auVar81,0xe8);
      auVar82._0_4_ = auVar82._4_4_;
      auVar82._8_4_ = auVar82._12_4_;
      auVar55 = pshuflw(auVar75,auVar82,0xe8);
      auVar80._8_4_ = 0xffffffff;
      auVar80._0_8_ = 0xffffffffffffffff;
      auVar80._12_4_ = 0xffffffff;
      auVar80 = (auVar55 | auVar65 & auVar75) ^ auVar80;
      auVar75 = packssdw(auVar80,auVar80);
      if ((auVar75 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pbVar44[-0x348] = false;
      }
      auVar14._4_4_ = iVar93;
      auVar14._0_4_ = iVar93;
      auVar14._8_4_ = iVar97;
      auVar14._12_4_ = iVar97;
      auVar82 = auVar81 & auVar14 | auVar82;
      auVar75 = packssdw(auVar82,auVar82);
      auVar65._8_4_ = 0xffffffff;
      auVar65._0_8_ = 0xffffffffffffffff;
      auVar65._12_4_ = 0xffffffff;
      auVar75 = packssdw(auVar75 ^ auVar65,auVar75 ^ auVar65);
      auVar75 = packsswb(auVar75,auVar75);
      if ((auVar75._0_4_ >> 8 & 1) != 0) {
        pbVar44[-0x310] = false;
      }
      auVar75 = (auVar73 | auVar32) ^ auVar64;
      auVar66._0_4_ = -(uint)(iVar37 < auVar75._0_4_);
      auVar66._4_4_ = -(uint)(iVar77 < auVar75._4_4_);
      auVar66._8_4_ = -(uint)(iVar78 < auVar75._8_4_);
      auVar66._12_4_ = -(uint)(iVar79 < auVar75._12_4_);
      auVar83._4_4_ = auVar66._0_4_;
      auVar83._0_4_ = auVar66._0_4_;
      auVar83._8_4_ = auVar66._8_4_;
      auVar83._12_4_ = auVar66._8_4_;
      iVar93 = -(uint)(auVar75._4_4_ == iVar77);
      iVar97 = -(uint)(auVar75._12_4_ == iVar79);
      auVar15._4_4_ = iVar93;
      auVar15._0_4_ = iVar93;
      auVar15._8_4_ = iVar97;
      auVar15._12_4_ = iVar97;
      auVar94._4_4_ = auVar66._4_4_;
      auVar94._0_4_ = auVar66._4_4_;
      auVar94._8_4_ = auVar66._12_4_;
      auVar94._12_4_ = auVar66._12_4_;
      auVar75 = auVar15 & auVar83 | auVar94;
      auVar75 = packssdw(auVar75,auVar75);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar75 = packssdw(auVar75 ^ auVar5,auVar75 ^ auVar5);
      auVar75 = packsswb(auVar75,auVar75);
      if ((auVar75._0_4_ >> 0x10 & 1) != 0) {
        pbVar44[-0x2d8] = false;
      }
      auVar75 = pshufhw(auVar75,auVar83,0x84);
      auVar16._4_4_ = iVar93;
      auVar16._0_4_ = iVar93;
      auVar16._8_4_ = iVar97;
      auVar16._12_4_ = iVar97;
      auVar55 = pshufhw(auVar66,auVar16,0x84);
      auVar80 = pshufhw(auVar75,auVar94,0x84);
      auVar56._8_4_ = 0xffffffff;
      auVar56._0_8_ = 0xffffffffffffffff;
      auVar56._12_4_ = 0xffffffff;
      auVar56 = (auVar80 | auVar55 & auVar75) ^ auVar56;
      auVar75 = packssdw(auVar56,auVar56);
      auVar75 = packsswb(auVar75,auVar75);
      if ((auVar75._0_4_ >> 0x18 & 1) != 0) {
        pbVar44[-0x2a0] = false;
      }
      auVar75 = (auVar73 | auVar31) ^ auVar64;
      auVar67._0_4_ = -(uint)(iVar37 < auVar75._0_4_);
      auVar67._4_4_ = -(uint)(iVar77 < auVar75._4_4_);
      auVar67._8_4_ = -(uint)(iVar78 < auVar75._8_4_);
      auVar67._12_4_ = -(uint)(iVar79 < auVar75._12_4_);
      auVar17._4_4_ = auVar67._0_4_;
      auVar17._0_4_ = auVar67._0_4_;
      auVar17._8_4_ = auVar67._8_4_;
      auVar17._12_4_ = auVar67._8_4_;
      auVar55 = pshuflw(auVar94,auVar17,0xe8);
      auVar57._0_4_ = -(uint)(auVar75._0_4_ == iVar37);
      auVar57._4_4_ = -(uint)(auVar75._4_4_ == iVar77);
      auVar57._8_4_ = -(uint)(auVar75._8_4_ == iVar78);
      auVar57._12_4_ = -(uint)(auVar75._12_4_ == iVar79);
      auVar84._4_4_ = auVar57._4_4_;
      auVar84._0_4_ = auVar57._4_4_;
      auVar84._8_4_ = auVar57._12_4_;
      auVar84._12_4_ = auVar57._12_4_;
      auVar75 = pshuflw(auVar57,auVar84,0xe8);
      auVar85._4_4_ = auVar67._4_4_;
      auVar85._0_4_ = auVar67._4_4_;
      auVar85._8_4_ = auVar67._12_4_;
      auVar85._12_4_ = auVar67._12_4_;
      auVar80 = pshuflw(auVar67,auVar85,0xe8);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar75 = packssdw(auVar75 & auVar55,(auVar80 | auVar75 & auVar55) ^ auVar6);
      auVar75 = packsswb(auVar75,auVar75);
      if ((auVar75 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pbVar44[-0x268] = false;
      }
      auVar18._4_4_ = auVar67._0_4_;
      auVar18._0_4_ = auVar67._0_4_;
      auVar18._8_4_ = auVar67._8_4_;
      auVar18._12_4_ = auVar67._8_4_;
      auVar85 = auVar84 & auVar18 | auVar85;
      auVar80 = packssdw(auVar85,auVar85);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar75 = packssdw(auVar75,auVar80 ^ auVar7);
      auVar75 = packsswb(auVar75,auVar75);
      if ((auVar75._4_2_ >> 8 & 1) != 0) {
        pbVar44[-0x230] = false;
      }
      auVar75 = (auVar73 | auVar30) ^ auVar64;
      auVar68._0_4_ = -(uint)(iVar37 < auVar75._0_4_);
      auVar68._4_4_ = -(uint)(iVar77 < auVar75._4_4_);
      auVar68._8_4_ = -(uint)(iVar78 < auVar75._8_4_);
      auVar68._12_4_ = -(uint)(iVar79 < auVar75._12_4_);
      auVar86._4_4_ = auVar68._0_4_;
      auVar86._0_4_ = auVar68._0_4_;
      auVar86._8_4_ = auVar68._8_4_;
      auVar86._12_4_ = auVar68._8_4_;
      iVar93 = -(uint)(auVar75._4_4_ == iVar77);
      iVar97 = -(uint)(auVar75._12_4_ == iVar79);
      auVar19._4_4_ = iVar93;
      auVar19._0_4_ = iVar93;
      auVar19._8_4_ = iVar97;
      auVar19._12_4_ = iVar97;
      auVar95._4_4_ = auVar68._4_4_;
      auVar95._0_4_ = auVar68._4_4_;
      auVar95._8_4_ = auVar68._12_4_;
      auVar95._12_4_ = auVar68._12_4_;
      auVar75 = auVar19 & auVar86 | auVar95;
      auVar75 = packssdw(auVar75,auVar75);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar75 = packssdw(auVar75 ^ auVar8,auVar75 ^ auVar8);
      auVar75 = packsswb(auVar75,auVar75);
      if ((auVar75 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pbVar44[-0x1f8] = false;
      }
      auVar75 = pshufhw(auVar75,auVar86,0x84);
      auVar20._4_4_ = iVar93;
      auVar20._0_4_ = iVar93;
      auVar20._8_4_ = iVar97;
      auVar20._12_4_ = iVar97;
      auVar55 = pshufhw(auVar68,auVar20,0x84);
      auVar80 = pshufhw(auVar75,auVar95,0x84);
      auVar58._8_4_ = 0xffffffff;
      auVar58._0_8_ = 0xffffffffffffffff;
      auVar58._12_4_ = 0xffffffff;
      auVar58 = (auVar80 | auVar55 & auVar75) ^ auVar58;
      auVar75 = packssdw(auVar58,auVar58);
      auVar75 = packsswb(auVar75,auVar75);
      if ((auVar75._6_2_ >> 8 & 1) != 0) {
        pbVar44[-0x1c0] = false;
      }
      auVar75 = (auVar73 | auVar29) ^ auVar64;
      auVar69._0_4_ = -(uint)(iVar37 < auVar75._0_4_);
      auVar69._4_4_ = -(uint)(iVar77 < auVar75._4_4_);
      auVar69._8_4_ = -(uint)(iVar78 < auVar75._8_4_);
      auVar69._12_4_ = -(uint)(iVar79 < auVar75._12_4_);
      auVar21._4_4_ = auVar69._0_4_;
      auVar21._0_4_ = auVar69._0_4_;
      auVar21._8_4_ = auVar69._8_4_;
      auVar21._12_4_ = auVar69._8_4_;
      auVar55 = pshuflw(auVar95,auVar21,0xe8);
      auVar59._0_4_ = -(uint)(auVar75._0_4_ == iVar37);
      auVar59._4_4_ = -(uint)(auVar75._4_4_ == iVar77);
      auVar59._8_4_ = -(uint)(auVar75._8_4_ == iVar78);
      auVar59._12_4_ = -(uint)(auVar75._12_4_ == iVar79);
      auVar87._4_4_ = auVar59._4_4_;
      auVar87._0_4_ = auVar59._4_4_;
      auVar87._8_4_ = auVar59._12_4_;
      auVar87._12_4_ = auVar59._12_4_;
      auVar75 = pshuflw(auVar59,auVar87,0xe8);
      auVar88._4_4_ = auVar69._4_4_;
      auVar88._0_4_ = auVar69._4_4_;
      auVar88._8_4_ = auVar69._12_4_;
      auVar88._12_4_ = auVar69._12_4_;
      auVar80 = pshuflw(auVar69,auVar88,0xe8);
      auVar70._8_4_ = 0xffffffff;
      auVar70._0_8_ = 0xffffffffffffffff;
      auVar70._12_4_ = 0xffffffff;
      auVar70 = (auVar80 | auVar75 & auVar55) ^ auVar70;
      auVar80 = packssdw(auVar70,auVar70);
      auVar75 = packsswb(auVar75 & auVar55,auVar80);
      if ((auVar75 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pbVar44[-0x188] = false;
      }
      auVar22._4_4_ = auVar69._0_4_;
      auVar22._0_4_ = auVar69._0_4_;
      auVar22._8_4_ = auVar69._8_4_;
      auVar22._12_4_ = auVar69._8_4_;
      auVar88 = auVar87 & auVar22 | auVar88;
      auVar80 = packssdw(auVar88,auVar88);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar80 = packssdw(auVar80 ^ auVar9,auVar80 ^ auVar9);
      auVar75 = packsswb(auVar75,auVar80);
      if ((auVar75._8_2_ >> 8 & 1) != 0) {
        pbVar44[-0x150] = false;
      }
      auVar75 = (auVar73 | auVar28) ^ auVar64;
      auVar71._0_4_ = -(uint)(iVar37 < auVar75._0_4_);
      auVar71._4_4_ = -(uint)(iVar77 < auVar75._4_4_);
      auVar71._8_4_ = -(uint)(iVar78 < auVar75._8_4_);
      auVar71._12_4_ = -(uint)(iVar79 < auVar75._12_4_);
      auVar89._4_4_ = auVar71._0_4_;
      auVar89._0_4_ = auVar71._0_4_;
      auVar89._8_4_ = auVar71._8_4_;
      auVar89._12_4_ = auVar71._8_4_;
      iVar93 = -(uint)(auVar75._4_4_ == iVar77);
      iVar97 = -(uint)(auVar75._12_4_ == iVar79);
      auVar23._4_4_ = iVar93;
      auVar23._0_4_ = iVar93;
      auVar23._8_4_ = iVar97;
      auVar23._12_4_ = iVar97;
      auVar96._4_4_ = auVar71._4_4_;
      auVar96._0_4_ = auVar71._4_4_;
      auVar96._8_4_ = auVar71._12_4_;
      auVar96._12_4_ = auVar71._12_4_;
      auVar75 = auVar23 & auVar89 | auVar96;
      auVar75 = packssdw(auVar75,auVar75);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar75 = packssdw(auVar75 ^ auVar10,auVar75 ^ auVar10);
      auVar75 = packsswb(auVar75,auVar75);
      if ((auVar75 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pbVar44[-0x118] = false;
      }
      auVar75 = pshufhw(auVar75,auVar89,0x84);
      auVar24._4_4_ = iVar93;
      auVar24._0_4_ = iVar93;
      auVar24._8_4_ = iVar97;
      auVar24._12_4_ = iVar97;
      auVar55 = pshufhw(auVar71,auVar24,0x84);
      auVar80 = pshufhw(auVar75,auVar96,0x84);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      auVar60 = (auVar80 | auVar55 & auVar75) ^ auVar60;
      auVar75 = packssdw(auVar60,auVar60);
      auVar75 = packsswb(auVar75,auVar75);
      if ((auVar75._10_2_ >> 8 & 1) != 0) {
        pbVar44[-0xe0] = false;
      }
      auVar75 = (auVar73 | _DAT_01fabe80) ^ auVar64;
      auVar72._0_4_ = -(uint)(iVar37 < auVar75._0_4_);
      auVar72._4_4_ = -(uint)(iVar77 < auVar75._4_4_);
      auVar72._8_4_ = -(uint)(iVar78 < auVar75._8_4_);
      auVar72._12_4_ = -(uint)(iVar79 < auVar75._12_4_);
      auVar25._4_4_ = auVar72._0_4_;
      auVar25._0_4_ = auVar72._0_4_;
      auVar25._8_4_ = auVar72._8_4_;
      auVar25._12_4_ = auVar72._8_4_;
      auVar55 = pshuflw(auVar96,auVar25,0xe8);
      auVar61._0_4_ = -(uint)(auVar75._0_4_ == iVar37);
      auVar61._4_4_ = -(uint)(auVar75._4_4_ == iVar77);
      auVar61._8_4_ = -(uint)(auVar75._8_4_ == iVar78);
      auVar61._12_4_ = -(uint)(auVar75._12_4_ == iVar79);
      auVar90._4_4_ = auVar61._4_4_;
      auVar90._0_4_ = auVar61._4_4_;
      auVar90._8_4_ = auVar61._12_4_;
      auVar90._12_4_ = auVar61._12_4_;
      auVar75 = pshuflw(auVar61,auVar90,0xe8);
      auVar91._4_4_ = auVar72._4_4_;
      auVar91._0_4_ = auVar72._4_4_;
      auVar91._8_4_ = auVar72._12_4_;
      auVar91._12_4_ = auVar72._12_4_;
      auVar80 = pshuflw(auVar72,auVar91,0xe8);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar75 = packssdw(auVar75 & auVar55,(auVar80 | auVar75 & auVar55) ^ auVar11);
      auVar75 = packsswb(auVar75,auVar75);
      if ((auVar75 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pbVar44[-0xa8] = false;
      }
      auVar26._4_4_ = auVar72._0_4_;
      auVar26._0_4_ = auVar72._0_4_;
      auVar26._8_4_ = auVar72._8_4_;
      auVar26._12_4_ = auVar72._8_4_;
      auVar91 = auVar90 & auVar26 | auVar91;
      auVar80 = packssdw(auVar91,auVar91);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar75 = packssdw(auVar75,auVar80 ^ auVar12);
      auVar75 = packsswb(auVar75,auVar75);
      if ((auVar75._12_2_ >> 8 & 1) != 0) {
        pbVar44[-0x70] = false;
      }
      auVar75 = (auVar73 | _DAT_01fabe70) ^ auVar64;
      auVar62._0_4_ = -(uint)(iVar37 < auVar75._0_4_);
      auVar62._4_4_ = -(uint)(iVar77 < auVar75._4_4_);
      auVar62._8_4_ = -(uint)(iVar78 < auVar75._8_4_);
      auVar62._12_4_ = -(uint)(iVar79 < auVar75._12_4_);
      auVar92._4_4_ = auVar62._0_4_;
      auVar92._0_4_ = auVar62._0_4_;
      auVar92._8_4_ = auVar62._8_4_;
      auVar92._12_4_ = auVar62._8_4_;
      auVar74._4_4_ = -(uint)(auVar75._4_4_ == iVar77);
      auVar74._12_4_ = -(uint)(auVar75._12_4_ == iVar79);
      auVar74._0_4_ = auVar74._4_4_;
      auVar74._8_4_ = auVar74._12_4_;
      auVar76._4_4_ = auVar62._4_4_;
      auVar76._0_4_ = auVar62._4_4_;
      auVar76._8_4_ = auVar62._12_4_;
      auVar76._12_4_ = auVar62._12_4_;
      auVar80 = auVar74 & auVar92 | auVar76;
      auVar75 = packssdw(auVar62,auVar80);
      auVar13._8_4_ = 0xffffffff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13._12_4_ = 0xffffffff;
      auVar75 = packssdw(auVar75 ^ auVar13,auVar75 ^ auVar13);
      auVar75 = packsswb(auVar75,auVar75);
      if ((auVar75 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pbVar44[-0x38] = false;
      }
      auVar75 = pshufhw(auVar75,auVar92,0x84);
      in_XMM2 = pshufhw(auVar80,auVar74,0x84);
      in_XMM2 = in_XMM2 & auVar75;
      auVar75 = pshufhw(auVar75,auVar76,0x84);
      auVar63._8_4_ = 0xffffffff;
      auVar63._0_8_ = 0xffffffffffffffff;
      auVar63._12_4_ = 0xffffffff;
      auVar63 = (auVar75 | in_XMM2) ^ auVar63;
      auVar75 = packssdw(auVar63,auVar63);
      in_XMM1 = packsswb(auVar75,auVar75);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        *pbVar44 = false;
      }
      uVar52 = uVar52 + 0x10;
      pbVar44 = pbVar44 + 0x380;
    } while ((uVar40 / 7 + 0x10 & 0xfffffffffffffff0) != uVar52);
  }
  (this->levels).super_RawBufferView.modified = false;
  (this->edge_creases).super_RawBufferView.modified = false;
  (this->edge_crease_weights).super_RawBufferView.modified = false;
  (this->vertex_creases).super_RawBufferView.modified = false;
  (this->vertex_crease_weights).super_RawBufferView.modified = false;
  local_330 = (vector_t<unsigned_int,_embree::aligned_monitored_allocator<unsigned_int,_4UL>_> *)
              getSeconds();
  bVar35 = State::verbosity(&((this->super_Geometry).device)->super_State,2);
  if (bVar35) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"half edge generation = ",0x17);
    local_330 = (vector_t<unsigned_int,_embree::aligned_monitored_allocator<unsigned_int,_4UL>_> *)
                ((double)local_330 - local_308);
    poVar41 = std::ostream::_M_insert<double>((double)local_330 * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar41,"ms, ",4);
    auVar64._0_8_ = (double)CONCAT44(0x43300000,(int)this->numHalfEdges);
    auVar64._8_4_ = (int)(this->numHalfEdges >> 0x20);
    auVar64._12_4_ = 0x45300000;
    poVar41 = std::ostream::_M_insert<double>
                        ((((auVar64._8_8_ - 1.9342813113834067e+25) +
                          (auVar64._0_8_ - 4503599627370496.0)) * 1e-06) / (double)local_330);
    std::__ostream_insert<char,std::char_traits<char>>(poVar41,"M/s",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar41 + -0x18) + (char)poVar41);
    std::ostream::put((char)poVar41);
    std::ostream::flush();
    printStatistics(this);
  }
  return;
}

Assistant:

void SubdivMesh::initializeHalfEdgeStructures ()
  {
    double t0 = getSeconds();

    invalid_face.resize(numFaces()*numTimeSteps);
 
    /* calculate start edge of each face */
    faceStartEdge.resize(numFaces());
    
    if (faceVertices.isLocalModified())
    {
      numHalfEdges = parallel_prefix_sum(faceVertices,faceStartEdge,numFaces(),0,std::plus<unsigned>());

      /* calculate face of each half edge */
      halfEdgeFace.resize(numHalfEdges);
      for (size_t f=0, h=0; f<numFaces(); f++)
        for (size_t e=0; e<faceVertices[f]; e++)
          halfEdgeFace[h++] = (unsigned int) f;
    }
    
    /* create set with all vertex creases */
    if (vertex_creases.isLocalModified() || vertex_crease_weights.isLocalModified())
      vertexCreaseMap->vertexCreaseMap.init(vertex_creases,vertex_crease_weights);
    
    /* create map with all edge creases */
    if (edge_creases.isLocalModified() || edge_crease_weights.isLocalModified())
      edgeCreaseMap->edgeCreaseMap.init(edge_creases,edge_crease_weights);

    /* create set with all holes */
    if (holes.isLocalModified())
      holeSet->holeSet.init(holes);

    /* create topology */
    for (auto& t: topology)
      t.initializeHalfEdgeStructures();

    /* create interpolation cache mapping for interpolatable meshes */
    for (size_t i=0; i<vertex_buffer_tags.size(); i++)
      vertex_buffer_tags[i].resize(numFaces()*numInterpolationSlots4(vertices[i].getStride()));
    for (size_t i=0; i<vertexAttribs.size(); i++)
      if (vertexAttribs[i]) vertex_attrib_buffer_tags[i].resize(numFaces()*numInterpolationSlots4(vertexAttribs[i].getStride()));

    /* cleanup some state for static scenes */
    /* if (scene_ == nullptr || scene_->isStaticAccel()) 
    {
      vertexCreaseMap->vertexCreaseMap.clear();
      edgeCreaseMap->edgeCreaseMap.clear();
    } */

    /* clear modified state of all buffers */
    faceVertices.clearLocalModified();
    holes.clearLocalModified();
    for (auto& buffer : vertices) buffer.clearLocalModified(); 
    levels.clearLocalModified();
    edge_creases.clearLocalModified();
    edge_crease_weights.clearLocalModified();
    vertex_creases.clearLocalModified();
    vertex_crease_weights.clearLocalModified();

    double t1 = getSeconds();

    /* print statistics in verbose mode */
    if (device->verbosity(2)) {
      std::cout << "half edge generation = " << 1000.0*(t1-t0) << "ms, " << 1E-6*double(numHalfEdges)/(t1-t0) << "M/s" << std::endl;
      printStatistics();
    }
  }